

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O2

void __thiscall
supermap::SortedSingleFileIndexedStorage<int,int,void,int>::find
          (SortedSingleFileIndexedStorage<int,int,void,int> *this)

{
  function<bool_(const_int_&,_const_int_&)> *in_RCX;
  function<bool_(const_int_&,_const_int_&)> *in_RDX;
  int *in_RSI;
  
  SortedSingleFileIndexedStorage<int,_int,_void,_int>::find
            ((SortedSingleFileIndexedStorage<int,_int,_void,_int> *)(this + -0x30),in_RSI,in_RDX,
             in_RCX);
  return;
}

Assistant:

std::optional<T> find(
        const FindPattern &pattern,
        std::function<bool(const T &, const FindPattern &)> less,
        std::function<bool(const T &, const FindPattern &)> equal
    ) override {
        if (getItemsCount() == 0) {
            return std::nullopt;
        }
        IndexT firstLeq = 0;
        IndexT lastGt = getItemsCount();
        while (lastGt - firstLeq > 1) {
            IndexT middle = (firstLeq + lastGt) / 2;
            T middleElem = get(middle);
            if (less(middleElem, pattern) || equal(middleElem, pattern)) {
                firstLeq = middle;
            } else {
                lastGt = middle;
            }
        }
        if (firstLeq >= getItemsCount()) {
            return std::nullopt;
        }
        T firstLeqElem = get(firstLeq);
        return equal(firstLeqElem, pattern) ? std::optional{firstLeqElem} : std::nullopt;
    }